

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int __c;
  char *__s;
  int local_14;
  
  Descriptor::GetLocationPath(*(Descriptor **)(this + 0x38),output);
  __s = "\x02";
  std::vector<int,_std::allocator<int>_>::push_back(output,&DescriptorProto::kFieldFieldNumber);
  index(this,__s,__c);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_14);
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(vector<int>* output) const {
  containing_type()->GetLocationPath(output);
  output->push_back(DescriptorProto::kFieldFieldNumber);
  output->push_back(index());
}